

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O3

BeagleResourceList * beagleGetResourceList(void)

{
  ulong *puVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *plVar5;
  BeagleResourceList *pBVar6;
  long lVar7;
  BeagleResource *pBVar8;
  list<BeagleResource,_std::allocator<BeagleResource>_> *__x;
  int iVar9;
  uint uVar10;
  uint uVar11;
  size_t __size;
  _Node_conflict *__tmp;
  _List_node_base *p_Var12;
  _List_node_base *p_Var13;
  list<BeagleResource,_std::allocator<BeagleResource>_> rList;
  pair<int,_int> local_60;
  _List_node_base *local_58;
  BeagleResourceList *local_50;
  _List_node_base local_48;
  
  if (plugins_abi_cxx11_ ==
      (list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)0x0) {
    beagleLoadPlugins();
  }
  if (rsrcList == (BeagleResourceList *)0x0) {
    pBVar6 = (BeagleResourceList *)malloc(0x10);
    plVar5 = plugins_abi_cxx11_;
    rsrcList = pBVar6;
    pBVar6->length = 0;
    p_Var13 = (plVar5->
              super__List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>)
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var13 == (_List_node_base *)plVar5) {
      __size = 0;
    }
    else {
      do {
        lVar7 = (**(code **)((long)(p_Var13[1]._M_next)->_M_next + 0x18))();
        pBVar6 = rsrcList;
        iVar9 = rsrcList->length + *(int *)(lVar7 + 0x10);
        rsrcList->length = iVar9;
        p_Var13 = (((_List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>
                     *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var13 != (_List_node_base *)plugins_abi_cxx11_);
      __size = (long)iVar9 << 5;
    }
    pBVar8 = (BeagleResource *)malloc(__size);
    pBVar6->list = pBVar8;
    p_Var13 = (plugins_abi_cxx11_->
              super__List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>)
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var13 != (_List_node_base *)plugins_abi_cxx11_) {
      uVar11 = 0;
      do {
        __x = (list<BeagleResource,_std::allocator<BeagleResource>_> *)
              (**(code **)(*(long *)p_Var13[1]._M_next + 0x18))();
        std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::list
                  ((list<BeagleResource,_std::allocator<BeagleResource>_> *)&local_48,__x);
        uVar10 = uVar11;
        if (local_48._M_next != &local_48) {
          p_Var12 = local_48._M_next;
          local_58 = p_Var13;
          do {
            if ((int)uVar11 < 1) {
LAB_00107260:
              local_60.second = uVar10 - uVar11;
              local_60.first = uVar10;
              std::
              _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              ::_M_emplace_unique<std::pair<int,int>>
                        ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                          *)&ResourceMap,&local_60);
              p_Var13 = p_Var12[1]._M_prev;
              p_Var2 = p_Var12[2]._M_next;
              p_Var3 = p_Var12[2]._M_prev;
              lVar7 = (long)(int)uVar10;
              uVar10 = uVar10 + 1;
              pBVar8 = rsrcList->list + lVar7;
              pBVar8->name = (char *)p_Var12[1]._M_next;
              pBVar8->description = (char *)p_Var13;
              pBVar8->supportFlags = (long)p_Var2;
              pBVar8->requiredFlags = (long)p_Var3;
            }
            else {
              p_Var13 = p_Var12[1]._M_next;
              lVar7 = 0;
              bVar4 = false;
              pBVar8 = rsrcList->list;
              local_50 = rsrcList;
              do {
                iVar9 = strcmp(*(char **)((long)&pBVar8->name + lVar7),(char *)p_Var13);
                if (iVar9 == 0) {
                  if (!bVar4) {
                    bVar4 = true;
                    local_50->length = local_50->length + -1;
                  }
                  puVar1 = (ulong *)((long)&pBVar8->supportFlags + lVar7);
                  *puVar1 = *puVar1 | (ulong)p_Var12[2]._M_next;
                }
                lVar7 = lVar7 + 0x20;
              } while ((ulong)uVar11 << 5 != lVar7);
              if (!bVar4) goto LAB_00107260;
            }
            p_Var12 = p_Var12->_M_next;
            p_Var13 = local_58;
          } while (p_Var12 != &local_48);
        }
        uVar11 = uVar10;
        p_Var12 = local_48._M_next;
        while (p_Var12 != &local_48) {
          p_Var2 = p_Var12->_M_next;
          operator_delete(p_Var12);
          p_Var12 = p_Var2;
        }
        p_Var13 = (((_List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>
                     *)&p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var13 != (_List_node_base *)plugins_abi_cxx11_);
    }
  }
  return rsrcList;
}

Assistant:

BeagleResourceList* beagleGetResourceList() {
    // plugins must be loaded before resources
    if (plugins==NULL)
        beagleLoadPlugins();

    if (rsrcList == NULL) {
        // count the total resources across plugins
        rsrcList = (BeagleResourceList*) malloc(sizeof(BeagleResourceList));
        rsrcList->length = 0;
        std::list<beagle::plugin::Plugin*>::iterator plugin_iter = plugins->begin();
        for(; plugin_iter != plugins->end(); plugin_iter++ ){
            rsrcList->length += (*plugin_iter)->getBeagleResources().size();
        }

        // allocate space for a complete list of resources
        rsrcList->list = (BeagleResource*) malloc(sizeof(BeagleResource) * rsrcList->length);

        // copy in resource lists from each plugin
        int rI=0;
        for(plugin_iter = plugins->begin(); plugin_iter != plugins->end(); plugin_iter++ ){
            std::list<BeagleResource> rList = (*plugin_iter)->getBeagleResources();
            std::list<BeagleResource>::iterator r_iter = rList.begin();
            int prev_rI = rI;
            for(; r_iter != rList.end(); r_iter++){
                bool rsrcExists = false;
                for(int i=0; i<prev_rI; i++){
                    if (strcmp(rsrcList->list[i].name, r_iter->name) == 0) {
                        if (!rsrcExists) {
                            rsrcExists = true;
                            rsrcList->length--;
                        }
                        rsrcList->list[i].supportFlags |= r_iter->supportFlags;
                    }
                }

                if (!rsrcExists) {
                    ResourceMap.insert(std::pair<int, int>(rI, (rI - prev_rI)));
                    rsrcList->list[rI++] = *r_iter;
                }
            }
        }
    }
    return rsrcList;
}